

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::Seek(FileStdio *this,size_t start)

{
  long in_RSI;
  long in_RDI;
  int status;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_120 [24];
  unsigned_long in_stack_fffffffffffffef8;
  string local_100 [4];
  int in_stack_ffffffffffffff04;
  string *in_stack_ffffffffffffff08;
  FileStdio *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [24];
  FileStdio *in_stack_ffffffffffffff80;
  undefined1 local_71 [56];
  allocator local_39;
  string local_38 [36];
  int local_14;
  
  if (in_RSI == -1) {
    SeekToEnd(in_stack_ffffffffffffff80);
  }
  else {
    WaitForOpen(in_stack_ffffffffffffff10);
    local_14 = fseek(*(FILE **)(in_RDI + 0xf0),0,0);
    if (local_14 == -1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"Toolkit",&local_39);
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_71;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_71 + 1),"transport::file::FileStdio",(allocator *)__lhs);
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,"Seek",(allocator *)__rhs);
      std::__cxx11::to_string(in_stack_fffffffffffffef8);
      std::operator+((char *)__lhs,__rhs);
      std::operator+(__lhs,(char *)__rhs);
      std::operator+(__lhs,__rhs);
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (string *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 in_stack_ffffffffffffff04);
      std::__cxx11::string::~string(local_c0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_120);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator(&local_99);
      std::__cxx11::string::~string((string *)(local_71 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_71);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  return;
}

Assistant:

void FileStdio::Seek(const size_t start)
{
    if (start != MaxSizeT)
    {
        WaitForOpen();
        const auto status = std::fseek(m_File, 0, SEEK_SET);
        if (status == -1)
        {
            helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "Seek",
                                                  "couldn't seek to offset " +
                                                      std::to_string(start) + " of file " + m_Name);
        }
    }
    else
    {
        SeekToEnd();
    }
}